

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O0

int erkStep_Resize(ARKodeMem ark_mem,N_Vector y0,sunrealtype hscale,sunrealtype t0,
                  ARKVecResizeFn resize,void *resize_data)

{
  int iVar1;
  ARKodeMem ark_mem_00;
  ARKVecResizeFn resize_00;
  long in_RSI;
  ARKodeMem in_RDI;
  int retval;
  int i;
  sunindextype liw_diff;
  sunindextype lrw_diff;
  sunindextype liw1;
  sunindextype lrw1;
  ARKodeERKStepMem step_mem;
  ARKodeERKStepMem *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int iVar2;
  long local_50;
  long local_48;
  N_Vector *in_stack_ffffffffffffffc0;
  int local_4;
  
  local_4 = erkStep_AccessStepMem
                      ((ARKodeMem)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (local_4 == 0) {
    local_50 = 0;
    local_48 = 0;
    if (*(long *)(*(long *)(in_RSI + 8) + 0x20) != 0) {
      N_VSpace(in_RSI,&local_48,&local_50);
    }
    ark_mem_00 = (ARKodeMem)(local_48 - in_RDI->lrw1);
    resize_00 = (ARKVecResizeFn)(local_50 - in_RDI->liw1);
    in_RDI->lrw1 = local_48;
    in_RDI->liw1 = local_50;
    for (iVar2 = 0; iVar2 < *(int *)(in_stack_ffffffffffffffc0 + 4); iVar2 = iVar2 + 1) {
      iVar1 = arkResizeVec(ark_mem_00,resize_00,(void *)CONCAT44(iVar2,local_4),
                           (sunindextype)in_stack_ffffffffffffff90,
                           (sunindextype)(&in_stack_ffffffffffffffc0[2]->content + iVar2),
                           (N_Vector)0x1511fc,in_stack_ffffffffffffffc0);
      if (iVar1 == 0) {
        arkProcessError(in_RDI,-0x14,0x100,"erkStep_Resize",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                        ,"Unable to resize vector");
        return -0x14;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int erkStep_Resize(ARKodeMem ark_mem, N_Vector y0,
                   SUNDIALS_MAYBE_UNUSED sunrealtype hscale,
                   SUNDIALS_MAYBE_UNUSED sunrealtype t0, ARKVecResizeFn resize,
                   void* resize_data)
{
  ARKodeERKStepMem step_mem;
  sunindextype lrw1, liw1, lrw_diff, liw_diff;
  int i, retval;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Determine change in vector sizes */
  lrw1 = liw1 = 0;
  if (y0->ops->nvspace != NULL) { N_VSpace(y0, &lrw1, &liw1); }
  lrw_diff      = lrw1 - ark_mem->lrw1;
  liw_diff      = liw1 - ark_mem->liw1;
  ark_mem->lrw1 = lrw1;
  ark_mem->liw1 = liw1;

  /* Resize the RHS vectors */
  for (i = 0; i < step_mem->stages; i++)
  {
    if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff, liw_diff, y0,
                      &step_mem->F[i]))
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "Unable to resize vector");
      return (ARK_MEM_FAIL);
    }
  }

  return (ARK_SUCCESS);
}